

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TermPass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,MatchCharNode *deferredCharNode,
          bool *previousSurrogatePart)

{
  code *pcVar1;
  CharSet<char16_t> *pCVar2;
  CharSet<char16_t> *pCVar3;
  CountDomain CVar4;
  CountDomain CVar5;
  CountDomain CVar6;
  uint16 uVar7;
  undefined4 uVar8;
  bool bVar9;
  EncodedChar EVar10;
  Char CVar11;
  CharCount lower;
  CharCountOrFlag upper;
  undefined4 *puVar12;
  DefineGroupNode *pDVar13;
  Node *pNVar14;
  char *pcVar15;
  char *error;
  NodeTag tag;
  uint uVar16;
  int groupId;
  DefineGroupNode *local_38;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  local_38 = (DefineGroupNode *)0x0;
  EVar10 = ECLookahead(this,0);
  switch(EVar10) {
  case L'$':
    ECConsume(this,1);
    pNVar14 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x35916e);
    tag = EOL;
LAB_00d1d2f0:
    SimpleNode::SimpleNode((SimpleNode *)pNVar14,tag);
    return pNVar14;
  case L'%':
  case L'&':
  case L'\'':
  case L',':
  case L'-':
switchD_00d1cc56_caseD_25:
    bVar9 = SurrogatePairPass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart);
    if (bVar9) break;
switchD_00d1ccac_caseD_5d:
    CVar11 = NextChar(this);
    deferredCharNode->cs[0] = CVar11;
    local_38 = (DefineGroupNode *)deferredCharNode;
    goto LAB_00d1cfcc;
  case L'(':
    ECConsume(this,1);
    EVar10 = ECLookahead(this,0);
    if (EVar10 == L'?') {
      EVar10 = ECLookahead(this,1);
      if (EVar10 == L'!') {
        ECConsume(this,2);
        pNVar14 = DisjunctionPass1(this);
        EVar10 = ECLookahead(this,0);
        if (EVar10 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x54f,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar9) goto LAB_00d1d6d0;
          *puVar12 = 0;
        }
        ECConsume(this,1);
        pDVar13 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        bVar9 = true;
      }
      else {
        if (EVar10 == L':') {
          ECConsume(this,2);
          local_38 = (DefineGroupNode *)DisjunctionPass1(this);
          EVar10 = ECLookahead(this,0);
          if (EVar10 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            error = "(ECLookahead() == \')\')";
            pcVar15 = "ECLookahead() == \')\'";
            uVar16 = 0x556;
            goto LAB_00d1cd33;
          }
          goto LAB_00d1cd44;
        }
        if (EVar10 != L'=') {
          groupId = this->nextGroupId;
          this->nextGroupId = groupId + 1;
          pNVar14 = DisjunctionPass1(this);
          EVar10 = ECLookahead(this,0);
          if (EVar10 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            uVar16 = 0x55e;
            goto LAB_00d1d361;
          }
          goto LAB_00d1d373;
        }
        ECConsume(this,2);
        pNVar14 = DisjunctionPass1(this);
        EVar10 = ECLookahead(this,0);
        if (EVar10 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x548,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar9) goto LAB_00d1d6d0;
          *puVar12 = 0;
        }
        ECConsume(this,1);
        pDVar13 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        bVar9 = false;
      }
      AssertionNode::AssertionNode((AssertionNode *)pDVar13,bVar9,pNVar14);
      local_38 = pDVar13;
    }
    else {
      groupId = this->nextGroupId;
      this->nextGroupId = groupId + 1;
      pNVar14 = DisjunctionPass1(this);
      EVar10 = ECLookahead(this,0);
      if (EVar10 != L')') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        uVar16 = 0x56a;
LAB_00d1d361:
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,uVar16,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
        if (!bVar9) goto LAB_00d1d6d0;
        *puVar12 = 0;
      }
LAB_00d1d373:
      ECConsume(this,1);
      pDVar13 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x35916e);
      DefineGroupNode::DefineGroupNode(pDVar13,groupId,pNVar14);
      local_38 = pDVar13;
    }
    break;
  case L')':
switchD_00d1cc56_caseD_29:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    pcVar15 = "false";
    uVar16 = 0x586;
    goto LAB_00d1cd92;
  case L'*':
  case L'+':
switchD_00d1cc56_caseD_2a:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    pcVar15 = "Allowed only in the escaped form. These should be caught by TermPass0.";
    uVar16 = 0x592;
LAB_00d1cd92:
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,uVar16,"(false)",pcVar15);
    if (!bVar9) goto LAB_00d1d6d0;
    *puVar12 = 0;
    break;
  case L'.':
    ECConsume(this,1);
    local_38 = (DefineGroupNode *)GetNodeWithValidCharacterSet(this,L'.');
    break;
  default:
    switch(EVar10) {
    case L'[':
      ECConsume(this,1);
      if (((this->unicodeFlagPresent == true) &&
          (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0)) &&
         (this->currentSurrogatePairNode->rangeLocation == this->next)) {
        local_38 = (DefineGroupNode *)CharacterClassPass1<true>(this);
      }
      else {
        local_38 = (DefineGroupNode *)CharacterClassPass1<false>(this);
      }
      EVar10 = ECLookahead(this,0);
      if (EVar10 != L']') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        error = "(ECLookahead() == \']\')";
        pcVar15 = "ECLookahead() == \']\'";
        uVar16 = 0x580;
LAB_00d1cd33:
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,uVar16,error,pcVar15);
        if (!bVar9) goto LAB_00d1d6d0;
        *puVar12 = 0;
      }
LAB_00d1cd44:
      ECConsume(this,1);
      break;
    case L'\\':
      ECConsume(this,1);
      bVar9 = SurrogatePairPass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart);
      if ((!bVar9) &&
         (bVar9 = AtomEscapePass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart),
         bVar9)) {
        return &local_38->super_Node;
      }
      break;
    case L']':
      goto switchD_00d1ccac_caseD_5d;
    case L'^':
      ECConsume(this,1);
      pNVar14 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x35916e);
      tag = BOL;
      goto LAB_00d1d2f0;
    default:
      if (EVar10 == L'\0') {
        if (this->inputLim <= this->next) {
          Fail(this,-0x7ff5ec67);
        }
      }
      else {
        if (EVar10 == L'?') goto switchD_00d1cc56_caseD_2a;
        if (EVar10 == L'|') goto switchD_00d1cc56_caseD_29;
      }
      goto switchD_00d1cc56_caseD_25;
    }
  }
  if (local_38 == (DefineGroupNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x5a7,"(node != 0)","node != 0");
    if (!bVar9) goto LAB_00d1d6d0;
    *puVar12 = 0;
  }
LAB_00d1cfcc:
  bVar9 = AtQuantifier(this);
  if (!bVar9) {
    return &local_38->super_Node;
  }
  EVar10 = ECLookahead(this,0);
  if (EVar10 == L'{') {
    if (local_38 == (DefineGroupNode *)deferredCharNode) {
      local_38 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
      (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_013df5e8;
      uVar7 = (deferredCharNode->super_Node).features;
      uVar8 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar2 = (deferredCharNode->super_Node).firstSet;
      pCVar3 = (deferredCharNode->super_Node).followSet;
      CVar4 = (deferredCharNode->super_Node).prevConsumes;
      CVar5 = (deferredCharNode->super_Node).thisConsumes;
      CVar6 = (deferredCharNode->super_Node).followConsumes;
      (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_38->super_Node).features = uVar7;
      *(undefined4 *)&(local_38->super_Node).field_0xc = uVar8;
      (local_38->super_Node).firstSet = pCVar2;
      (local_38->super_Node).followSet = pCVar3;
      (local_38->super_Node).prevConsumes = CVar4;
      (local_38->super_Node).thisConsumes = CVar5;
      (local_38->super_Node).followConsumes = CVar6;
      (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_013df950;
      local_38->body = *(Node **)deferredCharNode->cs;
      *(bool *)&local_38->groupId = deferredCharNode->isEquivClass;
    }
    ECConsume(this,1);
    lower = RepeatCount(this);
    EVar10 = ECLookahead(this,0);
    if (EVar10 == L'}') {
      ECConsume(this,1);
      bVar9 = OptNonGreedy(this);
      upper = lower;
      goto LAB_00d1d3cc;
    }
    if (EVar10 == L',') {
      ECConsume(this,1);
      EVar10 = ECLookahead(this,0);
      if (EVar10 != L'}') {
        upper = RepeatCount(this);
        if (upper < lower) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x5ce,"(lower <= upper)","lower <= upper");
          if (!bVar9) goto LAB_00d1d6d0;
          *puVar12 = 0;
        }
        EVar10 = ECLookahead(this,0);
        if (EVar10 != L'}') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x5cf,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
          if (!bVar9) goto LAB_00d1d6d0;
          *puVar12 = 0;
        }
        ECConsume(this,1);
        bVar9 = OptNonGreedy(this);
        goto LAB_00d1d3cc;
      }
      goto LAB_00d1d109;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    uVar16 = 0x5d7;
  }
  else {
    if (EVar10 == L'+') {
      if (local_38 == (DefineGroupNode *)deferredCharNode) {
        local_38 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_013df5e8;
        uVar7 = (deferredCharNode->super_Node).features;
        uVar8 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar2 = (deferredCharNode->super_Node).firstSet;
        pCVar3 = (deferredCharNode->super_Node).followSet;
        CVar4 = (deferredCharNode->super_Node).prevConsumes;
        CVar5 = (deferredCharNode->super_Node).thisConsumes;
        CVar6 = (deferredCharNode->super_Node).followConsumes;
        (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_38->super_Node).features = uVar7;
        *(undefined4 *)&(local_38->super_Node).field_0xc = uVar8;
        (local_38->super_Node).firstSet = pCVar2;
        (local_38->super_Node).followSet = pCVar3;
        (local_38->super_Node).prevConsumes = CVar4;
        (local_38->super_Node).thisConsumes = CVar5;
        (local_38->super_Node).followConsumes = CVar6;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_013df950;
        local_38->body = *(Node **)deferredCharNode->cs;
        *(bool *)&local_38->groupId = deferredCharNode->isEquivClass;
      }
      lower = 1;
LAB_00d1d109:
      ECConsume(this,1);
      bVar9 = OptNonGreedy(this);
      upper = 0xffffffff;
LAB_00d1d3cc:
      pNVar14 = NewLoopNode(this,lower,upper,bVar9,&local_38->super_Node);
      return pNVar14;
    }
    if (EVar10 == L'?') {
      if (local_38 == (DefineGroupNode *)deferredCharNode) {
        local_38 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_013df5e8;
        uVar7 = (deferredCharNode->super_Node).features;
        uVar8 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar2 = (deferredCharNode->super_Node).firstSet;
        pCVar3 = (deferredCharNode->super_Node).followSet;
        CVar4 = (deferredCharNode->super_Node).prevConsumes;
        CVar5 = (deferredCharNode->super_Node).thisConsumes;
        CVar6 = (deferredCharNode->super_Node).followConsumes;
        (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_38->super_Node).features = uVar7;
        *(undefined4 *)&(local_38->super_Node).field_0xc = uVar8;
        (local_38->super_Node).firstSet = pCVar2;
        (local_38->super_Node).followSet = pCVar3;
        (local_38->super_Node).prevConsumes = CVar4;
        (local_38->super_Node).thisConsumes = CVar5;
        (local_38->super_Node).followConsumes = CVar6;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_013df950;
        local_38->body = *(Node **)deferredCharNode->cs;
        *(bool *)&local_38->groupId = deferredCharNode->isEquivClass;
      }
      ECConsume(this,1);
      bVar9 = OptNonGreedy(this);
      lower = 0;
      upper = 1;
      goto LAB_00d1d3cc;
    }
    if (EVar10 == L'*') {
      if (local_38 == (DefineGroupNode *)deferredCharNode) {
        local_38 = (DefineGroupNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_013df5e8;
        uVar7 = (deferredCharNode->super_Node).features;
        uVar8 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar2 = (deferredCharNode->super_Node).firstSet;
        pCVar3 = (deferredCharNode->super_Node).followSet;
        CVar4 = (deferredCharNode->super_Node).prevConsumes;
        CVar5 = (deferredCharNode->super_Node).thisConsumes;
        CVar6 = (deferredCharNode->super_Node).followConsumes;
        (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_38->super_Node).features = uVar7;
        *(undefined4 *)&(local_38->super_Node).field_0xc = uVar8;
        (local_38->super_Node).firstSet = pCVar2;
        (local_38->super_Node).followSet = pCVar3;
        (local_38->super_Node).prevConsumes = CVar4;
        (local_38->super_Node).thisConsumes = CVar5;
        (local_38->super_Node).followConsumes = CVar6;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_013df950;
        local_38->body = *(Node **)deferredCharNode->cs;
        *(bool *)&local_38->groupId = deferredCharNode->isEquivClass;
      }
      ECConsume(this,1);
      bVar9 = OptNonGreedy(this);
      lower = 0;
      upper = 0xffffffff;
      goto LAB_00d1d3cc;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    uVar16 = 0x5dd;
  }
  bVar9 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,uVar16,"(false)","false");
  if (bVar9) {
    *puVar12 = 0;
    return &local_38->super_Node;
  }
LAB_00d1d6d0:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Node* Parser<P, IsLiteral>::TermPass1(MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        Node* node = 0;
        bool containsSurrogatePair = false;
        switch (ECLookahead())
        {
        case '^':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::BOL); // No quantifier allowed
        case '$':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::EOL); // No quantifier allowed
        case '\\':
            ECConsume();
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; // For quantifier
            }
            else if (AtomEscapePass1(node, deferredCharNode, previousSurrogatePart))
            {
                return node; // No quantifier allowed
            }
            break; // else: fall-through for opt quantifier
        case '(':
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                switch (ECLookahead(1))
                {
                case '=':
                    ECConsume(2); // ?=
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, false, node);
                    break; // As per Annex B, allow this to be quantifiable
                case '!':
                    ECConsume(2); // ?!
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, true, node);
                    break; // As per Annex B, allow this to be quantifiable
                case ':':
                    ECConsume(2); // ?:
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    break; // fall-through for opt quantifier
                default:
                    {
                        // ? not yet consumed
                        int thisGroupId = nextGroupId++;
                        node = DisjunctionPass1();
                        Assert(ECLookahead() == ')');
                        ECConsume(); // )
                        node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                        break; // fall-through for opt quantifier
                    }
                }
                break;
            default:
                {
                    // next char not yet consumed
                    int thisGroupId = nextGroupId++;
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                    break; // fall-through for opt quantifier
                }
            }
            break;
        case '.':
            {
                ECConsume();
                node = GetNodeWithValidCharacterSet('.');
                break; // fall-through for opt quantifier
            }
        case '[':
            ECConsume();
            if (unicodeFlagPresent)
            {
                containsSurrogatePair = this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->rangeLocation == next;
            }

            node = containsSurrogatePair ? CharacterClassPass1<true>() : CharacterClassPass1<false>();

            Assert(ECLookahead() == ']');
            ECConsume(); // ]
            break; // fall-through for opt quantifier
#if DBG
        case ')':
        case '|':
            Assert(false);
            break;
#endif
        case ']':
            // SPEC DEVIATION: This should be syntax error, instead accept as itself
            deferredCharNode->cs[0] = NextChar();
            node = deferredCharNode;
            break; // fall-through for opt quantifier
#if DBG
        case '*':
        case '+':
        case '?':
            AssertMsg(false, "Allowed only in the escaped form. These should be caught by TermPass0.");
            break;
#endif
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; //For quantifier
            }
            else
            {
                deferredCharNode->cs[0] = NextChar();
                node = deferredCharNode;
                break; // fall-through for opt quantifier
            }
        }

        Assert(node != 0);

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, CharCountFlag, OptNonGreedy(), node);
            case '+':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(1, CharCountFlag, OptNonGreedy(), node);
            case '?':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, 1, OptNonGreedy(), node);
            case '{':
                {
                    if (node == deferredCharNode)
                        node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            return NewLoopNode(lower, CharCountFlag, OptNonGreedy(), node);
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            Assert(lower <= upper);
                            Assert(ECLookahead() == '}');
                            ECConsume(); // }
                            return NewLoopNode(lower, upper, OptNonGreedy(), node);
                        }
                    case '}':
                        ECConsume();
                        return NewLoopNode(lower, lower, OptNonGreedy(), node);
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }

        return node;
    }